

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O3

void __thiscall
cmExtraSublimeTextGenerator::CreateNewProjectFile
          (cmExtraSublimeTextGenerator *this,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs,string *filename)

{
  cmMakefile *mf;
  int iVar1;
  cmSystemTools *pcVar2;
  char *pcVar3;
  ostream *poVar4;
  char *in_RCX;
  MapSourceFileFlags sourceFileFlags;
  cmGeneratedFileStream fout;
  undefined1 local_2e0 [32];
  _Base_ptr local_2c0;
  size_t local_2b8;
  string local_2b0;
  long *local_290 [2];
  long local_280 [2];
  undefined1 local_270 [584];
  
  mf = (*(lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
         super__Vector_impl_data._M_start)->Makefile;
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_270,(filename->_M_dataplus)._M_p,false);
  if (((byte)(*(_func_int **)(local_270._0_8_ + -0x18))[(long)(local_270 + 0x20)] & 5) != 0)
  goto LAB_00313a23;
  pcVar2 = (cmSystemTools *)
           cmLocalGenerator::GetBinaryDirectory
                     (*(lgs->
                       super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
                       _M_impl.super__Vector_impl_data._M_start);
  pcVar3 = cmLocalGenerator::GetSourceDirectory
                     (*(lgs->
                       super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
                       _M_impl.super__Vector_impl_data._M_start);
  cmSystemTools::RelativePath_abi_cxx11_(&local_2b0,pcVar2,pcVar3,in_RCX);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_270,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_270,"\t\"folders\":\n\t[\n\t",0x10);
  if (local_2b0._M_string_length == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_270,"\t{\n\t\t\t\"path\": \"./\"",0x12);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_270,"\t{\n\t\t\t\"path\": \"",0xf);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_270,local_2b0._M_dataplus._M_p,local_2b0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"",1);
    pcVar2 = (cmSystemTools *)
             cmLocalGenerator::GetSourceDirectory
                       (*(lgs->
                         super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                         )._M_impl.super__Vector_impl_data._M_start);
    pcVar3 = cmLocalGenerator::GetBinaryDirectory
                       (*(lgs->
                         super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                         )._M_impl.super__Vector_impl_data._M_start);
    cmSystemTools::RelativePath_abi_cxx11_((string *)local_2e0,pcVar2,pcVar3,in_RCX);
    if (CONCAT44(local_2e0._12_4_,local_2e0._8_4_) != 0) {
      if (2 < CONCAT44(local_2e0._12_4_,local_2e0._8_4_)) {
        std::__cxx11::string::substr((ulong)local_290,(ulong)local_2e0);
        iVar1 = std::__cxx11::string::compare((char *)local_290);
        if (local_290[0] != local_280) {
          operator_delete(local_290[0],local_280[0] + 1);
        }
        if (iVar1 == 0) goto LAB_00313928;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_270,",\n\t\t\t\"folder_exclude_patterns\": [\"",0x22);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_270,(char *)local_2e0._0_8_,
                          CONCAT44(local_2e0._12_4_,local_2e0._8_4_));
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"]",2);
    }
LAB_00313928:
    if ((undefined1 *)local_2e0._0_8_ != local_2e0 + 0x10) {
      operator_delete((void *)local_2e0._0_8_,local_2e0._16_8_ + 1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_270,"\n\t\t}",4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_270,"\n\t]",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_270,",\n\t\"build_systems\":\n\t[\n\t",0x18);
  local_2e0._24_8_ = local_2e0 + 8;
  local_2e0._8_4_ = _S_red;
  local_2e0._16_8_ = 0;
  local_2b8 = 0;
  local_2c0 = (_Base_ptr)local_2e0._24_8_;
  AppendAllTargets(this,lgs,mf,(cmGeneratedFileStream *)local_270,(MapSourceFileFlags *)local_2e0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_270,"\n\t]",3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_270,"\n\t}",3);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               *)local_2e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
LAB_00313a23:
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_270);
  return;
}

Assistant:

void cmExtraSublimeTextGenerator
  ::CreateNewProjectFile(const std::vector<cmLocalGenerator*>& lgs,
                         const std::string& filename)
{
  const cmMakefile* mf=lgs[0]->GetMakefile();
  cmGeneratedFileStream fout(filename.c_str());
  if(!fout)
    {
    return;
    }

  const std::string &sourceRootRelativeToOutput = cmSystemTools::RelativePath(
                     lgs[0]->GetBinaryDirectory(),
                     lgs[0]->GetSourceDirectory());
  // Write the folder entries to the project file
  fout << "{\n";
  fout << "\t\"folders\":\n\t[\n\t";
  if (!sourceRootRelativeToOutput.empty())
    {
      fout << "\t{\n\t\t\t\"path\": \"" << sourceRootRelativeToOutput << "\"";
      const std::string &outputRelativeToSourceRoot =
        cmSystemTools::RelativePath(lgs[0]->GetSourceDirectory(),
                                    lgs[0]->GetBinaryDirectory());
      if ((!outputRelativeToSourceRoot.empty()) &&
        ((outputRelativeToSourceRoot.length() < 3) ||
          (outputRelativeToSourceRoot.substr(0, 3) != "../")))
        {
        fout << ",\n\t\t\t\"folder_exclude_patterns\": [\"" <<
                outputRelativeToSourceRoot << "\"]";
        }
    }
  else
    {
      fout << "\t{\n\t\t\t\"path\": \"./\"";
    }
  fout << "\n\t\t}";
  // End of the folders section
  fout << "\n\t]";

  // Write the beginning of the build systems section to the project file
  fout << ",\n\t\"build_systems\":\n\t[\n\t";

  // Set of include directories over all targets (sublime text/sublimeclang
  // doesn't currently support these settings per build system, only project
  // wide
  MapSourceFileFlags sourceFileFlags;
  AppendAllTargets(lgs, mf, fout, sourceFileFlags);

  // End of build_systems
  fout << "\n\t]";
  fout << "\n\t}";
}